

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagator.hpp
# Opt level: O0

void __thiscall
Propagator::Propagator
          (Propagator *this,uint wave_height,uint wave_width,bool periodic_output,
          PropagatorState *propagator_state)

{
  byte bVar1;
  size_type sVar2;
  byte in_CL;
  undefined4 in_EDX;
  undefined4 in_ESI;
  size_type *in_RDI;
  vector<std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>,_std::allocator<std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>_>_>
  *in_R8;
  Propagator *unaff_retaddr;
  undefined7 in_stack_00000020;
  undefined7 in_stack_ffffffffffffffe8;
  size_type *height;
  
  bVar1 = in_CL & 1;
  height = in_RDI;
  sVar2 = std::
          vector<std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>,_std::allocator<std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>_>_>
          ::size(in_R8);
  *in_RDI = sVar2;
  std::
  vector<std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>,_std::allocator<std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>_>_>
  ::vector((vector<std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>,_std::allocator<std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>_>_>
            *)CONCAT17(periodic_output,in_stack_00000020),propagator_state);
  *(undefined4 *)(in_RDI + 4) = in_EDX;
  *(undefined4 *)((long)in_RDI + 0x24) = in_ESI;
  *(byte *)(in_RDI + 5) = bVar1 & 1;
  std::
  vector<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>_>_>
  ::vector((vector<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>_>_>
            *)0x114887);
  Array3D<std::array<int,_4UL>_>::Array3D
            ((Array3D<std::array<int,_4UL>_> *)unaff_retaddr,(size_t)height,CONCAT44(in_ESI,in_EDX),
             CONCAT17(bVar1,in_stack_ffffffffffffffe8));
  init_compatible(unaff_retaddr);
  return;
}

Assistant:

Propagator(unsigned wave_height, unsigned wave_width, bool periodic_output,
             PropagatorState propagator_state) noexcept
      : patterns_size(propagator_state.size()),
        propagator_state(propagator_state), wave_width(wave_width),
        wave_height(wave_height), periodic_output(periodic_output),
        compatible(wave_height, wave_width, patterns_size) {
    init_compatible();
  }